

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Lexer_TestBlockStringNoWs_Test::~Lexer_TestBlockStringNoWs_Test
          (Lexer_TestBlockStringNoWs_Test *this)

{
  void *in_RDI;
  
  ~Lexer_TestBlockStringNoWs_Test((Lexer_TestBlockStringNoWs_Test *)0x181348);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Lexer, TestBlockStringNoWs)
{
    const char str[] =
        "|||\n"
        "test\n"
        "|||";
    testLex("block string no ws",
            str,
            {},
            "block string no ws:1:1: text block's first line must start with"
            " whitespace.");
}